

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O3

bool wallet::RunWithinTxn
               (WalletDatabase *database,string_view process_desc,
               function<bool_(wallet::WalletBatch_&)> *func)

{
  bool bVar1;
  function<bool_(wallet::WalletBatch_&)> *in_R8;
  long in_FS_OFFSET;
  string_view process_desc_00;
  long *local_40;
  WalletDatabase *local_38;
  long local_30;
  
  process_desc_00._M_len = process_desc._M_str;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (*database->_vptr_WalletDatabase[0xe])((wallet *)&local_40,database,1);
  process_desc_00._M_str = (char *)func;
  local_38 = database;
  bVar1 = RunWithinTxn((wallet *)&local_40,(WalletBatch *)process_desc._M_len,process_desc_00,in_R8)
  ;
  if (local_40 != (long *)0x0) {
    (**(code **)(*local_40 + 0x28))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool RunWithinTxn(WalletDatabase& database, std::string_view process_desc, const std::function<bool(WalletBatch&)>& func)
{
    WalletBatch batch(database);
    return RunWithinTxn(batch, process_desc, func);
}